

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlDrawRenderBatch(RenderBatch *batch)

{
  Matrix *pMVar1;
  GLenum GVar2;
  DrawCall *pDVar3;
  Matrix left;
  Matrix left_00;
  Matrix right;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  _Bool _Var28;
  int i_2;
  int iVar29;
  VertexBuffer *pVVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  int i_1;
  GLint GVar34;
  int i;
  long lVar35;
  long lVar36;
  Matrix matMVP;
  float16 buffer;
  Matrix matModelView;
  Matrix matProjection;
  
  pVVar30 = batch->vertexBuffer;
  lVar33 = (long)batch->currentBuffer;
  if (0 < pVVar30[lVar33].vCounter) {
    if (RLGL.ExtSupported.vao) {
      (*glad_glBindVertexArray)(pVVar30[lVar33].vaoId);
      pVVar30 = batch->vertexBuffer;
      lVar33 = (long)batch->currentBuffer;
    }
    (*glad_glBindBuffer)(0x8892,pVVar30[lVar33].vboId[0]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)batch->vertexBuffer[batch->currentBuffer].vCounter * 0xc,
               batch->vertexBuffer[batch->currentBuffer].vertices);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)batch->vertexBuffer[batch->currentBuffer].vCounter << 3,
               batch->vertexBuffer[batch->currentBuffer].texcoords);
    (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
    (*glad_glBufferSubData)
              (0x8892,0,(long)batch->vertexBuffer[batch->currentBuffer].vCounter << 2,
               batch->vertexBuffer[batch->currentBuffer].colors);
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
  }
  _Var28 = RLGL.State.stereoRender;
  uVar27 = RLGL.State.projection._56_8_;
  uVar26 = RLGL.State.projection._48_8_;
  uVar25 = RLGL.State.projection._40_8_;
  uVar24 = RLGL.State.projection._32_8_;
  uVar23 = RLGL.State.projection._24_8_;
  uVar22 = RLGL.State.projection._16_8_;
  uVar21 = RLGL.State.projection._8_8_;
  uVar20 = RLGL.State.projection._0_8_;
  uVar18 = RLGL.State.modelview._56_8_;
  uVar16 = RLGL.State.modelview._48_8_;
  uVar14 = RLGL.State.modelview._40_8_;
  uVar12 = RLGL.State.modelview._32_8_;
  uVar10 = RLGL.State.modelview._24_8_;
  uVar8 = RLGL.State.modelview._16_8_;
  uVar6 = RLGL.State.modelview._8_8_;
  uVar4 = RLGL.State.modelview._0_8_;
  uVar31 = (ulong)RLGL.State.stereoRender;
  for (lVar33 = 0; lVar33 != uVar31 + 1; lVar33 = lVar33 + 1) {
    if (_Var28 != false) {
      (*glad_glViewport)(((int)lVar33 * RLGL.State.framebufferWidth) / 2,0,
                         RLGL.State.framebufferWidth / 2,RLGL.State.framebufferHeight);
      uVar19 = RLGL.State.modelview._56_8_;
      uVar17 = RLGL.State.modelview._48_8_;
      uVar15 = RLGL.State.modelview._40_8_;
      uVar13 = RLGL.State.modelview._32_8_;
      uVar11 = RLGL.State.modelview._24_8_;
      uVar9 = RLGL.State.modelview._16_8_;
      uVar7 = RLGL.State.modelview._8_8_;
      uVar5 = RLGL.State.modelview._0_8_;
      RLGL.State.modelview.m8 = (float)uVar6;
      RLGL.State.modelview.m12 = SUB84(uVar6,4);
      left.m8 = RLGL.State.modelview.m8;
      left.m12 = RLGL.State.modelview.m12;
      RLGL.State.modelview.m0 = (float)uVar4;
      RLGL.State.modelview.m4 = SUB84(uVar4,4);
      left.m0 = RLGL.State.modelview.m0;
      left.m4 = RLGL.State.modelview.m4;
      RLGL.State.modelview.m1 = (float)uVar8;
      RLGL.State.modelview.m5 = SUB84(uVar8,4);
      left.m1 = RLGL.State.modelview.m1;
      left.m5 = RLGL.State.modelview.m5;
      RLGL.State.modelview.m9 = (float)uVar10;
      RLGL.State.modelview.m13 = SUB84(uVar10,4);
      left.m9 = RLGL.State.modelview.m9;
      left.m13 = RLGL.State.modelview.m13;
      RLGL.State.modelview.m2 = (float)uVar12;
      RLGL.State.modelview.m6 = SUB84(uVar12,4);
      left.m2 = RLGL.State.modelview.m2;
      left.m6 = RLGL.State.modelview.m6;
      RLGL.State.modelview.m10 = (float)uVar14;
      RLGL.State.modelview.m14 = SUB84(uVar14,4);
      left.m10 = RLGL.State.modelview.m10;
      left.m14 = RLGL.State.modelview.m14;
      RLGL.State.modelview.m3 = (float)uVar16;
      RLGL.State.modelview.m7 = SUB84(uVar16,4);
      left.m3 = RLGL.State.modelview.m3;
      left.m7 = RLGL.State.modelview.m7;
      RLGL.State.modelview.m11 = (float)uVar18;
      RLGL.State.modelview.m15 = SUB84(uVar18,4);
      left.m11 = RLGL.State.modelview.m11;
      left.m15 = RLGL.State.modelview.m15;
      RLGL.State.modelview._0_8_ = uVar5;
      RLGL.State.modelview._8_8_ = uVar7;
      RLGL.State.modelview._16_8_ = uVar9;
      RLGL.State.modelview._24_8_ = uVar11;
      RLGL.State.modelview._32_8_ = uVar13;
      RLGL.State.modelview._40_8_ = uVar15;
      RLGL.State.modelview._48_8_ = uVar17;
      RLGL.State.modelview._56_8_ = uVar19;
      MatrixMultiply(left,RLGL.State.viewOffsetStereo[lVar33]);
      RLGL.State.modelview.m4 = matMVP.m4;
      RLGL.State.modelview.m0 = matMVP.m0;
      RLGL.State.modelview.m12 = matMVP.m12;
      RLGL.State.modelview.m8 = matMVP.m8;
      RLGL.State.modelview.m5 = matMVP.m5;
      RLGL.State.modelview.m1 = matMVP.m1;
      RLGL.State.modelview.m13 = matMVP.m13;
      RLGL.State.modelview.m9 = matMVP.m9;
      RLGL.State.modelview.m6 = matMVP.m6;
      RLGL.State.modelview.m2 = matMVP.m2;
      RLGL.State.modelview.m14 = matMVP.m14;
      RLGL.State.modelview.m10 = matMVP.m10;
      RLGL.State.modelview.m7 = matMVP.m7;
      RLGL.State.modelview.m3 = matMVP.m3;
      RLGL.State.modelview.m15 = matMVP.m15;
      RLGL.State.modelview.m11 = matMVP.m11;
      pMVar1 = RLGL.State.projectionStereo + lVar33;
      RLGL.State.projection.m0 = pMVar1->m0;
      RLGL.State.projection.m4 = pMVar1->m4;
      pMVar1 = RLGL.State.projectionStereo + lVar33;
      RLGL.State.projection.m8 = pMVar1->m8;
      RLGL.State.projection.m12 = pMVar1->m12;
      pMVar1 = RLGL.State.projectionStereo + lVar33;
      RLGL.State.projection.m1 = pMVar1->m1;
      RLGL.State.projection.m5 = pMVar1->m5;
      pMVar1 = RLGL.State.projectionStereo + lVar33;
      RLGL.State.projection.m9 = pMVar1->m9;
      RLGL.State.projection.m13 = pMVar1->m13;
      pMVar1 = RLGL.State.projectionStereo + lVar33;
      RLGL.State.projection.m2 = pMVar1->m2;
      RLGL.State.projection.m6 = pMVar1->m6;
      pMVar1 = RLGL.State.projectionStereo + lVar33;
      RLGL.State.projection.m10 = pMVar1->m10;
      RLGL.State.projection.m14 = pMVar1->m14;
      pMVar1 = RLGL.State.projectionStereo + lVar33;
      RLGL.State.projection.m3 = pMVar1->m3;
      RLGL.State.projection.m7 = pMVar1->m7;
      pMVar1 = RLGL.State.projectionStereo + lVar33;
      RLGL.State.projection.m11 = pMVar1->m11;
      RLGL.State.projection.m15 = pMVar1->m15;
    }
    if (0 < batch->vertexBuffer[batch->currentBuffer].vCounter) {
      (*glad_glUseProgram)(RLGL.State.currentShader.id);
      left_00.m8 = RLGL.State.modelview.m8;
      left_00.m12 = RLGL.State.modelview.m12;
      left_00.m0 = RLGL.State.modelview.m0;
      left_00.m4 = RLGL.State.modelview.m4;
      left_00.m1 = RLGL.State.modelview.m1;
      left_00.m5 = RLGL.State.modelview.m5;
      left_00.m9 = RLGL.State.modelview.m9;
      left_00.m13 = RLGL.State.modelview.m13;
      left_00.m2 = RLGL.State.modelview.m2;
      left_00.m6 = RLGL.State.modelview.m6;
      left_00.m10 = RLGL.State.modelview.m10;
      left_00.m14 = RLGL.State.modelview.m14;
      left_00.m3 = RLGL.State.modelview.m3;
      left_00.m7 = RLGL.State.modelview.m7;
      left_00.m11 = RLGL.State.modelview.m11;
      left_00.m15 = RLGL.State.modelview.m15;
      right.m8 = RLGL.State.projection.m8;
      right.m12 = RLGL.State.projection.m12;
      right.m0 = RLGL.State.projection.m0;
      right.m4 = RLGL.State.projection.m4;
      right.m1 = RLGL.State.projection.m1;
      right.m5 = RLGL.State.projection.m5;
      right.m9 = RLGL.State.projection.m9;
      right.m13 = RLGL.State.projection.m13;
      right.m2 = RLGL.State.projection.m2;
      right.m6 = RLGL.State.projection.m6;
      right.m10 = RLGL.State.projection.m10;
      right.m14 = RLGL.State.projection.m14;
      right.m3 = RLGL.State.projection.m3;
      right.m7 = RLGL.State.projection.m7;
      right.m11 = RLGL.State.projection.m11;
      right.m15 = RLGL.State.projection.m15;
      MatrixMultiply(left_00,right);
      (*glad_glUniformMatrix4fv)(RLGL.State.currentShader.locs[6],1,'\0',buffer.v);
      if (RLGL.ExtSupported.vao == true) {
        (*glad_glBindVertexArray)(batch->vertexBuffer[batch->currentBuffer].vaoId);
      }
      else {
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        (*glad_glVertexAttribPointer)(*RLGL.State.currentShader.locs,3,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(*RLGL.State.currentShader.locs);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        (*glad_glVertexAttribPointer)(RLGL.State.currentShader.locs[1],2,0x1406,'\0',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[1]);
        (*glad_glBindBuffer)(0x8892,batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        (*glad_glVertexAttribPointer)
                  (RLGL.State.currentShader.locs[5],4,0x1401,'\x01',0,(void *)0x0);
        (*glad_glEnableVertexAttribArray)(RLGL.State.currentShader.locs[5]);
        (*glad_glBindBuffer)(0x8893,batch->vertexBuffer[batch->currentBuffer].vboId[3]);
      }
      (*glad_glUniform4f)(RLGL.State.currentShader.locs[0xc],1.0,1.0,1.0,1.0);
      (*glad_glUniform1i)(RLGL.State.currentShader.locs[0xf],0);
      for (lVar35 = 0; lVar35 != 4; lVar35 = lVar35 + 1) {
        if (RLGL.State.activeTextureId[lVar35] != 0) {
          (*glad_glActiveTexture)((int)lVar35 + 0x84c1);
          (*glad_glBindTexture)(0xde1,RLGL.State.activeTextureId[lVar35]);
        }
      }
      (*glad_glActiveTexture)(0x84c0);
      lVar36 = 0;
      GVar34 = 0;
      for (lVar35 = 0; lVar35 < batch->drawsCounter; lVar35 = lVar35 + 1) {
        (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&batch->draws->textureId + lVar36));
        pDVar3 = batch->draws;
        GVar2 = *(GLenum *)((long)&pDVar3->mode + lVar36);
        if ((GVar2 == 4) || (GVar2 == 1)) {
          (*glad_glDrawArrays)(GVar2,GVar34,*(GLsizei *)((long)&pDVar3->vertexCount + lVar36));
        }
        else {
          (*glad_glDrawElements)
                    (4,(*(int *)((long)&pDVar3->vertexCount + lVar36) / 4) * 6,0x1405,
                     (void *)((long)((GVar34 / 4) * 6) << 2));
        }
        GVar34 = GVar34 + *(int *)((long)&batch->draws->vertexCount + lVar36) +
                 *(int *)((long)&batch->draws->vertexAlignment + lVar36);
        lVar36 = lVar36 + 0x10;
      }
      if (RLGL.ExtSupported.vao == false) {
        (*glad_glBindBuffer)(0x8892,0);
        (*glad_glBindBuffer)(0x8893,0);
      }
      (*glad_glBindTexture)(0xde1,0);
    }
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glBindVertexArray)(0);
    }
    (*glad_glUseProgram)(0);
  }
  batch->vertexBuffer[batch->currentBuffer].vCounter = 0;
  batch->vertexBuffer[batch->currentBuffer].tcCounter = 0;
  batch->vertexBuffer[batch->currentBuffer].cCounter = 0;
  batch->currentDepth = -1.0;
  RLGL.State.modelview._0_8_ = uVar4;
  RLGL.State.modelview._8_8_ = uVar6;
  RLGL.State.modelview._16_8_ = uVar8;
  RLGL.State.modelview._24_8_ = uVar10;
  RLGL.State.modelview._32_8_ = uVar12;
  RLGL.State.modelview._40_8_ = uVar14;
  RLGL.State.modelview._48_8_ = uVar16;
  RLGL.State.modelview._56_8_ = uVar18;
  RLGL.State.projection._0_8_ = uVar20;
  RLGL.State.projection._8_8_ = uVar21;
  RLGL.State.projection._16_8_ = uVar22;
  RLGL.State.projection._24_8_ = uVar23;
  RLGL.State.projection._32_8_ = uVar24;
  RLGL.State.projection._40_8_ = uVar25;
  RLGL.State.projection._48_8_ = uVar26;
  RLGL.State.projection._56_8_ = uVar27;
  for (lVar33 = 0; lVar33 != 0x1000; lVar33 = lVar33 + 0x10) {
    *(undefined4 *)((long)&batch->draws->mode + lVar33) = 7;
    *(undefined4 *)((long)&batch->draws->vertexCount + lVar33) = 0;
    *(uint *)((long)&batch->draws->textureId + lVar33) = RLGL.State.defaultTextureId;
  }
  for (lVar33 = 0; lVar33 != 4; lVar33 = lVar33 + 1) {
    RLGL.State.activeTextureId[lVar33] = 0;
  }
  batch->drawsCounter = 1;
  iVar29 = batch->currentBuffer + 1;
  iVar32 = 0;
  if (iVar29 < batch->buffersCount) {
    iVar32 = iVar29;
  }
  batch->currentBuffer = iVar32;
  return;
}

Assistant:

void rlDrawRenderBatch(RenderBatch *batch)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Update batch vertex buffers
    //------------------------------------------------------------------------------------------------------------
    // NOTE: If there is not vertex data, buffers doesn't need to be updated (vertexCount > 0)
    // TODO: If no data changed on the CPU arrays --> No need to re-update GPU arrays (change flag required)
    if (batch->vertexBuffer[batch->currentBuffer].vCounter > 0)
    {
        // Activate elements VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);

        // Vertex positions buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*3*sizeof(float), batch->vertexBuffer[batch->currentBuffer].vertices);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*3*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].vertices, GL_DYNAMIC_DRAW);  // Update all buffer

        // Texture coordinates buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*2*sizeof(float), batch->vertexBuffer[batch->currentBuffer].texcoords);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*2*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].texcoords, GL_DYNAMIC_DRAW); // Update all buffer

        // Colors buffer
        glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
        glBufferSubData(GL_ARRAY_BUFFER, 0, batch->vertexBuffer[batch->currentBuffer].vCounter*4*sizeof(unsigned char), batch->vertexBuffer[batch->currentBuffer].colors);
        //glBufferData(GL_ARRAY_BUFFER, sizeof(float)*4*4*batch->vertexBuffer[batch->currentBuffer].elementsCount, batch->vertexBuffer[batch->currentBuffer].colors, GL_DYNAMIC_DRAW);    // Update all buffer

        // NOTE: glMapBuffer() causes sync issue.
        // If GPU is working with this buffer, glMapBuffer() will wait(stall) until GPU to finish its job.
        // To avoid waiting (idle), you can call first glBufferData() with NULL pointer before glMapBuffer().
        // If you do that, the previous data in PBO will be discarded and glMapBuffer() returns a new
        // allocated pointer immediately even if GPU is still working with the previous data.

        // Another option: map the buffer object into client's memory
        // Probably this code could be moved somewhere else...
        // batch->vertexBuffer[batch->currentBuffer].vertices = (float *)glMapBuffer(GL_ARRAY_BUFFER, GL_READ_WRITE);
        // if (batch->vertexBuffer[batch->currentBuffer].vertices)
        // {
            // Update vertex data
        // }
        // glUnmapBuffer(GL_ARRAY_BUFFER);

        // Unbind the current VAO
        if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    }
    //------------------------------------------------------------------------------------------------------------

    // Draw batch vertex buffers (considering VR stereo if required)
    //------------------------------------------------------------------------------------------------------------
    Matrix matProjection = RLGL.State.projection;
    Matrix matModelView = RLGL.State.modelview;

    int eyesCount = 1;
    if (RLGL.State.stereoRender) eyesCount = 2;

    for (int eye = 0; eye < eyesCount; eye++)
    {
        if (eyesCount == 2)
        {
            // Setup current eye viewport (half screen width)
            rlViewport(eye*RLGL.State.framebufferWidth/2, 0, RLGL.State.framebufferWidth/2, RLGL.State.framebufferHeight);

            // Set current eye view offset to modelview matrix
            rlSetMatrixModelview(MatrixMultiply(matModelView, RLGL.State.viewOffsetStereo[eye]));
            // Set current eye projection matrix
            rlSetMatrixProjection(RLGL.State.projectionStereo[eye]);
        }

        // Draw buffers
        if (batch->vertexBuffer[batch->currentBuffer].vCounter > 0)
        {
            // Set current shader and upload current MVP matrix
            glUseProgram(RLGL.State.currentShader.id);

            // Create modelview-projection matrix and upload to shader
            Matrix matMVP = MatrixMultiply(RLGL.State.modelview, RLGL.State.projection);
            glUniformMatrix4fv(RLGL.State.currentShader.locs[SHADER_LOC_MATRIX_MVP], 1, false, MatrixToFloat(matMVP));

            if (RLGL.ExtSupported.vao) glBindVertexArray(batch->vertexBuffer[batch->currentBuffer].vaoId);
            else
            {
                // Bind vertex attrib: position (shader-location = 0)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[0]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION], 3, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_POSITION]);

                // Bind vertex attrib: texcoord (shader-location = 1)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[1]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01], 2, GL_FLOAT, 0, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_TEXCOORD01]);

                // Bind vertex attrib: color (shader-location = 3)
                glBindBuffer(GL_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[2]);
                glVertexAttribPointer(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR], 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0);
                glEnableVertexAttribArray(RLGL.State.currentShader.locs[SHADER_LOC_VERTEX_COLOR]);

                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, batch->vertexBuffer[batch->currentBuffer].vboId[3]);
            }

            // Setup some default shader values
            glUniform4f(RLGL.State.currentShader.locs[SHADER_LOC_COLOR_DIFFUSE], 1.0f, 1.0f, 1.0f, 1.0f);
            glUniform1i(RLGL.State.currentShader.locs[SHADER_LOC_MAP_DIFFUSE], 0);  // Active default sampler2D: texture0

            // Activate additional sampler textures
            // Those additional textures will be common for all draw calls of the batch
            for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++)
            {
                if (RLGL.State.activeTextureId[i] > 0)
                {
                    glActiveTexture(GL_TEXTURE0 + 1 + i);
                    glBindTexture(GL_TEXTURE_2D, RLGL.State.activeTextureId[i]);
                }
            }

            // Activate default sampler2D texture0 (one texture is always active for default batch shader)
            // NOTE: Batch system accumulates calls by texture0 changes, additional textures are enabled for all the draw calls
            glActiveTexture(GL_TEXTURE0);

            for (int i = 0, vertexOffset = 0; i < batch->drawsCounter; i++)
            {
                // Bind current draw call texture, activated as GL_TEXTURE0 and binded to sampler2D texture0 by default
                glBindTexture(GL_TEXTURE_2D, batch->draws[i].textureId);

                if ((batch->draws[i].mode == RL_LINES) || (batch->draws[i].mode == RL_TRIANGLES)) glDrawArrays(batch->draws[i].mode, vertexOffset, batch->draws[i].vertexCount);
                else
                {
#if defined(GRAPHICS_API_OPENGL_33)
                    // We need to define the number of indices to be processed: quadsCount*6
                    // NOTE: The final parameter tells the GPU the offset in bytes from the
                    // start of the index buffer to the location of the first index to process
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_INT, (GLvoid *)(vertexOffset/4*6*sizeof(GLuint)));
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
                    glDrawElements(GL_TRIANGLES, batch->draws[i].vertexCount/4*6, GL_UNSIGNED_SHORT, (GLvoid *)(vertexOffset/4*6*sizeof(GLushort)));
#endif
                }

                vertexOffset += (batch->draws[i].vertexCount + batch->draws[i].vertexAlignment);
            }

            if (!RLGL.ExtSupported.vao)
            {
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
            }

            glBindTexture(GL_TEXTURE_2D, 0);    // Unbind textures
        }

        if (RLGL.ExtSupported.vao) glBindVertexArray(0); // Unbind VAO

        glUseProgram(0);    // Unbind shader program
    }
    //------------------------------------------------------------------------------------------------------------

    // Reset batch buffers
    //------------------------------------------------------------------------------------------------------------
    // Reset vertex counters for next frame
    batch->vertexBuffer[batch->currentBuffer].vCounter = 0;
    batch->vertexBuffer[batch->currentBuffer].tcCounter = 0;
    batch->vertexBuffer[batch->currentBuffer].cCounter = 0;

    // Reset depth for next draw
    batch->currentDepth = -1.0f;

    // Restore projection/modelview matrices
    RLGL.State.projection = matProjection;
    RLGL.State.modelview = matModelView;

    // Reset RLGL.currentBatch->draws array
    for (int i = 0; i < DEFAULT_BATCH_DRAWCALLS; i++)
    {
        batch->draws[i].mode = RL_QUADS;
        batch->draws[i].vertexCount = 0;
        batch->draws[i].textureId = RLGL.State.defaultTextureId;
    }

    // Reset active texture units for next batch
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++) RLGL.State.activeTextureId[i] = 0;

    // Reset draws counter to one draw for the batch
    batch->drawsCounter = 1;
    //------------------------------------------------------------------------------------------------------------

    // Change to next buffer in the list (in case of multi-buffering)
    batch->currentBuffer++;
    if (batch->currentBuffer >= batch->buffersCount) batch->currentBuffer = 0;
#endif
}